

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O3

void kratos::set_slice_var_parent(Var **var,Var *target,Var *new_var,bool check_target)

{
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *pvVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  pointer psVar4;
  element_type *peVar5;
  pointer psVar6;
  InternalException *pIVar7;
  undefined1 auVar8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a8;
  element_type *peStack_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98;
  element_type *local_90;
  undefined1 auStack_88 [8];
  vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
  slices;
  undefined1 auStack_68 [8];
  shared_ptr<kratos::VarSlice> slice;
  shared_ptr<kratos::Var> new_var_ptr;
  
  auStack_68 = (undefined1  [8])0x0;
  slice.super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  auStack_88 = (undefined1  [8])0x0;
  slices.
  super__Vector_base<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  slices.
  super__Vector_base<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((*var)->type_ == Slice) {
    do {
      Var::as<kratos::VarSlice>
                ((Var *)&slice.super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount);
      peVar5 = new_var_ptr.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      auStack_68 = (undefined1  [8])
                   slice.super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount;
      peVar2 = slice.super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      slice.super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      new_var_ptr.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      slice.super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)peVar5;
      if ((peVar2 != (element_type *)0x0) &&
         (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar2),
         new_var_ptr.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
         (element_type *)0x0)) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   new_var_ptr.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      std::
      vector<std::shared_ptr<kratos::VarSlice>,std::allocator<std::shared_ptr<kratos::VarSlice>>>::
      emplace_back<std::shared_ptr<kratos::VarSlice>&>
                ((vector<std::shared_ptr<kratos::VarSlice>,std::allocator<std::shared_ptr<kratos::VarSlice>>>
                  *)auStack_88,(shared_ptr<kratos::VarSlice> *)auStack_68);
    } while ((*(Var **)((long)auStack_68 + 0x270))->type_ == Slice);
    if (*(Var **)((long)auStack_68 + 0x270) == target) {
      Var::as<kratos::Var>
                ((Var *)&slice.super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount);
      psVar4 = slices.
               super__Vector_base<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      psVar6 = slices.
               super__Vector_base<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
               ._M_impl.super__Vector_impl_data._M_start + -1;
      auVar8 = auStack_88;
      if ((ulong)auStack_88 < psVar6 &&
          auStack_88 !=
          (undefined1  [8])
          slices.
          super__Vector_base<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        do {
          peVar2 = (((pointer)auVar8)->
                   super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          (((pointer)auVar8)->super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>).
          _M_ptr = (psVar6->super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
          ;
          (psVar6->super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = peVar2
          ;
          p_Var3 = (psVar6->super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>).
                   _M_refcount._M_pi;
          (psVar6->super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
          _M_pi = (((pointer)auVar8)->
                  super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
                  _M_pi;
          (((pointer)auVar8)->super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>).
          _M_refcount._M_pi = p_Var3;
          auVar8 = (undefined1  [8])((long)auVar8 + 0x10);
          psVar6 = psVar6 + -1;
        } while ((ulong)auVar8 < psVar6);
      }
      if (auStack_88 !=
          (undefined1  [8])
          slices.
          super__Vector_base<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        auVar8 = auStack_88;
        do {
          peVar2 = (((pointer)auVar8)->
                   super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          local_98 = slice.super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
          local_90 = new_var_ptr.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if (new_var_ptr.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              pvVar1 = &((new_var_ptr.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_IRNode).fn_name_ln;
              *(int *)&(pvVar1->
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                       )._M_impl.super__Vector_impl_data._M_start =
                   *(int *)&(pvVar1->
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 1;
              UNLOCK();
            }
            else {
              pvVar1 = &((new_var_ptr.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_IRNode).fn_name_ln;
              *(int *)&(pvVar1->
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                       )._M_impl.super__Vector_impl_data._M_start =
                   *(int *)&(pvVar1->
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 1;
            }
          }
          (*(peVar2->super_Var).super_IRNode._vptr_IRNode[0x1e])(&local_a8,peVar2,&local_98);
          peVar5 = new_var_ptr.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          new_var_ptr.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               peStack_a0;
          slice.super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               local_a8;
          local_a8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          peStack_a0 = (element_type *)0x0;
          if ((peVar5 != (element_type *)0x0) &&
             (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar5),
             peStack_a0 != (element_type *)0x0)) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_a0);
          }
          if (local_90 != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90);
          }
          auVar8 = (undefined1  [8])((long)auVar8 + 0x10);
        } while (auVar8 != (undefined1  [8])psVar4);
      }
      *var = (Var *)slice.super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      if (new_var_ptr.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   new_var_ptr.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      goto LAB_001a94a7;
    }
  }
  else if (*var == target) {
    pIVar7 = (InternalException *)__cxa_allocate_exception(0x10);
    slice.super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         &new_var_ptr.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &slice.super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               "Slice cannot be null","");
    InternalException::InternalException
              (pIVar7,(string *)
                      &slice.super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount);
    __cxa_throw(pIVar7,&InternalException::typeinfo,std::runtime_error::~runtime_error);
  }
  if (check_target) {
    pIVar7 = (InternalException *)__cxa_allocate_exception(0x10);
    slice.super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         &new_var_ptr.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &slice.super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               "Target not found","");
    InternalException::InternalException
              (pIVar7,(string *)
                      &slice.super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount);
    __cxa_throw(pIVar7,&InternalException::typeinfo,std::runtime_error::~runtime_error);
  }
LAB_001a94a7:
  std::
  vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>::
  ~vector((vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
           *)auStack_88);
  if (slice.super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               slice.super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return;
}

Assistant:

void set_slice_var_parent(Var *&var, Var *target, Var *new_var, bool check_target) {
    std::shared_ptr<VarSlice> slice;
    Var *parent_var = var;
    std::vector<std::shared_ptr<VarSlice>> slices;
    while (parent_var->type() == VarType::Slice) {
        // this is for nested slicing
        slice = parent_var->as<VarSlice>();
        slices.emplace_back(slice);
        parent_var = slice->parent_var;
    }
    if (parent_var != target) {
        if (check_target)
            throw InternalException("Target not found");
        else
            return;
    }
    if (!slice) throw InternalException("Slice cannot be null");

    auto new_var_ptr = new_var->as<Var>();
    std::reverse(slices.begin(), slices.end());
    for (auto const &s : slices) {
        new_var_ptr = s->slice_var(new_var_ptr);
    }
    var = new_var_ptr.get();
}